

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<std::__cxx11::string_const&,char(&)[80]>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               char (*args_1) [80])

{
  char *in_stack_ffffffffffffffa8;
  FileLoc *loc;
  char (*in_stack_ffffffffffffffc8) [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  loc = (FileLoc *)&stack0xffffffffffffffc8;
  StringPrintf<std::__cxx11::string_const&,char(&)[80]>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::c_str();
  ErrorExit(loc,in_stack_ffffffffffffffa8);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}